

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQFuncState * __thiscall SQFuncState::PushChildState(SQFuncState *this,SQSharedState *ss)

{
  SQFuncState *pSVar1;
  sqvector<SQFuncState_*> *in_RDI;
  SQFuncState *child;
  void *in_stack_00000090;
  CompilerErrorFunc in_stack_00000098;
  SQFuncState *in_stack_000000a0;
  SQSharedState *in_stack_000000a8;
  SQFuncState *in_stack_000000b0;
  SQFuncState **in_stack_ffffffffffffffd8;
  
  pSVar1 = (SQFuncState *)sq_malloc(0x130f82);
  SQFuncState(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
              in_stack_00000090);
  sqvector<SQFuncState_*>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  return pSVar1;
}

Assistant:

SQFuncState *SQFuncState::PushChildState(SQSharedState *ss)
{
    SQFuncState *child = (SQFuncState *)sq_malloc(sizeof(SQFuncState));
    new (child) SQFuncState(ss,this,_errfunc,_errtarget);
    _childstates.push_back(child);
    return child;
}